

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curltest.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char **url2;
  
  url2 = argv;
  curl_global_init(3);
  if (argc < 2) {
    puts("error: first argument should be a url to download");
    iVar1 = 1;
  }
  else {
    iVar1 = GetWebFiles(argv[1],(char *)url2);
  }
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
  int retVal = 0;

  curl_global_init(CURL_GLOBAL_DEFAULT);

  if(argc>1)
    {
    retVal += GetWebFiles(argv[1], 0);
    }
  else
    {
    printf("error: first argument should be a url to download\n");
    retVal = 1;
    }

  /* Do not check the output of FTP socks5 cannot handle FTP yet */
  /* GetFtpFile(); */
  /* do not test ftp right now because we don't enable that port */

  curl_global_cleanup();

  return retVal;
}